

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

void dumpPointerGraph(DGLLVMPointerAnalysis *pta,PTType type)

{
  bool bVar1;
  const_iterator __lhs;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *__range2;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *nodes;
  PTType in_stack_0000016c;
  DGLLVMPointerAnalysis *in_stack_00000170;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
  local_28;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *local_20;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *local_18;
  
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x163cf0);
  if (bVar1) {
    dumpPointerGraphdot(in_stack_00000170,in_stack_0000016c);
  }
  else {
    local_20 = dg::DGLLVMPointerAnalysis::getNodes((DGLLVMPointerAnalysis *)0x163d13);
    local_18 = local_20;
    local_28._M_current =
         (unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
         std::
         vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
         ::begin(in_stack_ffffffffffffffc8);
    __lhs = std::
            vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
            ::end(in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           (vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
            *)__gnu_cxx::
              __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
              ::operator*(&local_28);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                         0x163d6c);
      if (bVar1) {
        std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::get
                  ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x163d7b);
        dumpPSNode((PSNode *)pta,type);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

static void dumpPointerGraph(DGLLVMPointerAnalysis *pta, PTType type) {
    assert(pta);

    if (todot)
        dumpPointerGraphdot(pta, type);
    else {
        const auto &nodes = pta->getNodes();
        for (const auto &node : nodes) {
            if (node) // node id 0 is nullptr
                dumpPSNode(node.get(), type);
        }
    }
}